

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall ChainstateManager::NotifyHeaderTip(ChainstateManager *this)

{
  CBlockIndex *pCVar1;
  CBlockIndex *pCVar2;
  Notifications *pNVar3;
  bool bVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &cs_main.super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  pCVar1 = this->m_best_header;
  pCVar2 = this->m_last_notified_header;
  if (pCVar1 == pCVar2) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  }
  else {
    bVar4 = IsInitialBlockDownload(this);
    this->m_last_notified_header = pCVar1;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
    pNVar3 = (this->m_options).notifications;
    uVar5 = 2;
    if (bVar4) {
      uVar5 = (ulong)((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1);
    }
    (*pNVar3->_vptr_Notifications[3])(pNVar3,uVar5,(long)pCVar1->nHeight,(ulong)pCVar1->nTime,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pCVar1 != pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::NotifyHeaderTip()
{
    bool fNotify = false;
    bool fInitialBlockDownload = false;
    CBlockIndex* pindexHeader = nullptr;
    {
        LOCK(GetMutex());
        pindexHeader = m_best_header;

        if (pindexHeader != m_last_notified_header) {
            fNotify = true;
            fInitialBlockDownload = IsInitialBlockDownload();
            m_last_notified_header = pindexHeader;
        }
    }
    // Send block tip changed notifications without the lock held
    if (fNotify) {
        GetNotifications().headerTip(GetSynchronizationState(fInitialBlockDownload, m_blockman.m_blockfiles_indexed), pindexHeader->nHeight, pindexHeader->nTime, false);
    }
    return fNotify;
}